

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_can_test.cpp
# Opt level: O2

void __thiscall SocketCAN::Socket::Socket(Socket *this,char *ifc)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  sockaddr local_28;
  undefined8 local_18;
  
  iVar1 = socket(0x1d,3,1);
  this->_fd = iVar1;
  if (iVar1 < 0) {
    perror("Error while opening socket");
    return;
  }
  local_28.sa_data._2_4_ = if_nametoindex(ifc);
  if (local_28.sa_data._2_4_ != 0) {
    local_18 = 0;
    local_28.sa_data[6] = '\0';
    local_28.sa_data[7] = '\0';
    local_28.sa_data[8] = '\0';
    local_28.sa_data[9] = '\0';
    local_28.sa_data[10] = '\0';
    local_28.sa_data[0xb] = '\0';
    local_28.sa_data[0xc] = '\0';
    local_28.sa_data[0xd] = '\0';
    local_28._0_4_ = 0x1d;
    iVar1 = bind(this->_fd,&local_28,0x18);
    if (iVar1 < 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to bind to the can socket: ");
      poVar2 = std::operator<<(poVar2,ifc);
      poVar2 = std::operator<<(poVar2,": error");
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      poVar2 = std::operator<<(poVar2,pcVar4);
      std::endl<char,std::char_traits<char>>(poVar2);
      close(this->_fd);
    }
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to get the SocketCAN interface index: ");
  poVar2 = std::operator<<(poVar2,ifc);
  poVar2 = std::operator<<(poVar2,": error");
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  poVar2 = std::operator<<(poVar2,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar2);
  close(this->_fd);
  return;
}

Assistant:

Socket(const char* ifc) {

    if((_fd = socket(PF_CAN, SOCK_RAW, CAN_RAW)) < 0) {
      perror("Error while opening socket");
      return;
    }

    auto ifindx = if_nametoindex(ifc);
    if (ifindx <= 0) {
      std::cerr << "Failed to get the SocketCAN interface index: "
                << ifc << ": error" << strerror(errno) << std::endl;

      close(_fd);
      return;
    }

    struct sockaddr_can addr{0};

    addr.can_family  = AF_CAN;
    addr.can_ifindex = static_cast<int>(ifindx);

    if(bind(_fd, reinterpret_cast<struct sockaddr *>(&addr), sizeof(addr)) < 0) {
      std::cerr << "Failed to bind to the can socket: "
                << ifc << ": error" << strerror(errno) << std::endl;

      close(_fd);
      return;
    }

  }